

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.cpp
# Opt level: O2

void __thiscall TPZStream::Write(TPZStream *this,longdouble *p,int howMany)

{
  void *pvVar1;
  ulong uVar2;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < howMany) {
    uVar2 = (ulong)(uint)howMany << 3;
  }
  pvVar1 = operator_new__(uVar2);
  for (uVar2 = 0; (ulong)(uint)howMany << 3 != uVar2; uVar2 = uVar2 + 8) {
    *(double *)((long)pvVar1 + uVar2) = (double)*(longdouble *)((long)p + uVar2 * 2);
  }
  (*this->_vptr_TPZStream[8])(this,pvVar1,(ulong)(uint)howMany);
  operator_delete__(pvVar1);
  return;
}

Assistant:

void TPZStream::Write(const long double *p, int howMany) {//weird but necessary for working between different OSs
    double *copy = new double[howMany];
    for (unsigned int i = 0; i < howMany; ++i) {
        copy[i] = (double) p[i];
    }
    Write(copy, howMany);
    delete[] copy;
}